

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FeatureSet_VisibilityFeature::FeatureSet_VisibilityFeature
          (FeatureSet_VisibilityFeature *this,Arena *arena,FeatureSet_VisibilityFeature *from)

{
  ulong uVar1;
  
  (this->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)arena;
  (this->super_ZeroFieldsBase)._impl_._cached_size_.atom_ = 0;
  (this->super_ZeroFieldsBase).super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ZeroFieldsBase_00589a00;
  uVar1 = (from->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

constexpr UninterpretedOption_NamePartDefaultTypeInternal() : _instance(::_pbi::ConstantInitialized{}) {}